

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O3

void Gia_ManMarkAutonomous(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  Gia_ManCleanMark0(p);
  Gia_ManIncrementTravId(p);
  iVar3 = p->nRegs;
  if (0 < iVar3) {
    iVar5 = 0;
    do {
      iVar1 = p->vCis->nSize;
      uVar4 = (iVar1 - iVar3) + iVar5;
      if (((int)uVar4 < 0) || (iVar1 <= (int)uVar4)) goto LAB_0074c483;
      iVar3 = p->vCis->pArray[uVar4];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0074c464;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManMarkAutonomous_rec(p,p->pObjs + iVar3);
      iVar5 = iVar5 + 1;
      iVar3 = p->nRegs;
    } while (iVar5 < iVar3);
  }
  Gia_ManIncrementTravId(p);
  iVar3 = p->nRegs;
  if (0 < iVar3) {
    pVVar2 = p->vCis;
    iVar5 = 0;
    do {
      iVar1 = pVVar2->nSize;
      uVar4 = (iVar1 - iVar3) + iVar5;
      if (((int)uVar4 < 0) || (iVar1 <= (int)uVar4)) {
LAB_0074c483:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pVVar2->pArray[uVar4];
      lVar6 = (long)iVar1;
      if ((lVar6 < 0) || (p->nObjs <= iVar1)) {
LAB_0074c464:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((p->pObjs[lVar6].field_0x3 & 0x40) != 0) {
        if (p->nTravIdsAlloc <= iVar1) {
          __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x23a,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
        }
        p->pTravIds[lVar6] = p->nTravIds;
        iVar3 = p->nRegs;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar3);
  }
  Gia_ManCleanMark0(p);
  return;
}

Assistant:

void Gia_ManMarkAutonomous( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanMark0( p );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManMarkAutonomous_rec( p, pObj );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachRo( p, pObj, i )
        if ( pObj->fMark0 )
            Gia_ObjSetTravIdCurrent( p, pObj );
    Gia_ManCleanMark0( p );
}